

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O1

CURLcode tftp_multi_statemach(connectdata *conn,_Bool *done)

{
  ulong uVar1;
  Curl_easy *pCVar2;
  tftp_state_data_t *state_00;
  tftp_state_data_t *state_01;
  socklen_t sVar3;
  CURLcode CVar4;
  int iVar5;
  tftp_event_t tVar6;
  int *piVar7;
  char *pcVar8;
  ssize_t sVar9;
  void *pvVar10;
  long lVar11;
  size_t sVar12;
  ulong __n;
  size_t sVar13;
  ulong uVar14;
  ushort *puVar15;
  tftp_state_data_t *state;
  bool bVar16;
  time_t current;
  ushort *local_e0;
  char *local_d8;
  socklen_t local_c4;
  ushort *local_c0;
  _Bool *local_b8;
  sockaddr local_b0 [8];
  
  pCVar2 = conn->data;
  state_00 = (conn->proto).tftpc;
  time((time_t *)local_b0);
  if (state_00->max_time < (long)local_b0[0]._0_8_) {
    state_00->error = TFTP_ERR_TIMEOUT;
    state_00->state = TFTP_STATE_FIN;
    bVar16 = true;
    tVar6 = TFTP_EVENT_NONE;
  }
  else {
    tVar6 = TFTP_EVENT_NONE;
    if ((long)state_00->retry_time + state_00->rx_time < (long)local_b0[0]._0_8_) {
      time(&state_00->rx_time);
      tVar6 = TFTP_EVENT_TIMEOUT;
    }
    bVar16 = state_00->max_time <= (long)local_b0[0]._0_8_;
  }
  *done = false;
  if (bVar16) {
    Curl_failf(pCVar2,"TFTP response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  if (tVar6 != TFTP_EVENT_NONE) {
    CVar4 = tftp_state_machine(state_00,tVar6);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    bVar16 = state_00->state == TFTP_STATE_FIN;
    *done = bVar16;
    goto joined_r0x0012f8aa;
  }
  iVar5 = Curl_socket_check(state_00->sockfd,-1,-1,0);
  if (iVar5 == 0) {
    return CURLE_OK;
  }
  if (iVar5 == -1) {
    piVar7 = __errno_location();
    pcVar8 = Curl_strerror(conn,*piVar7);
    Curl_failf(pCVar2,"%s",pcVar8);
    state_00->event = TFTP_EVENT_ERROR;
    return CURLE_OK;
  }
  pCVar2 = conn->data;
  state_01 = (conn->proto).tftpc;
  local_c4 = 0x80;
  local_b8 = done;
  sVar9 = recvfrom(state_01->sockfd,(state_01->rpacket).data,(long)state_01->blksize + 4,0,local_b0,
                   &local_c4);
  sVar3 = local_c4;
  state_01->rbytes = (int)sVar9;
  if (state_01->remote_addrlen == 0) {
    memcpy(&state_01->remote_addr,local_b0,(ulong)local_c4);
    state_01->remote_addrlen = sVar3;
  }
  lVar11 = (long)state_01->rbytes;
  if (lVar11 < 4) {
    CVar4 = CURLE_OK;
    Curl_failf(pCVar2,"Received too short packet");
    state_01->event = TFTP_EVENT_TIMEOUT;
  }
  else {
    puVar15 = (ushort *)(state_01->rpacket).data;
    tVar6 = (tftp_event_t)(ushort)(*puVar15 << 8 | *puVar15 >> 8);
    state_01->event = tVar6;
    switch(tVar6) {
    case TFTP_EVENT_DATA:
      if ((state_01->rbytes != 4) &&
         ((ushort)((short)*(undefined4 *)&state_01->block + 1U) ==
          (ushort)(puVar15[1] << 8 | puVar15[1] >> 8))) {
        CVar4 = Curl_client_write(conn,1,(char *)(puVar15 + 2),lVar11 - 4);
        if (CVar4 != CURLE_OK) {
          tftp_state_machine(state_01,TFTP_EVENT_ERROR);
          goto LAB_0012f885;
        }
        lVar11 = (long)state_01->rbytes + (pCVar2->req).bytecount + -4;
        (pCVar2->req).bytecount = lVar11;
        Curl_pgrsSetDownloadCounter(pCVar2,lVar11);
      }
      break;
    case TFTP_EVENT_ACK:
      break;
    case TFTP_EVENT_ERROR:
      state_01->error = (uint)(ushort)(puVar15[1] << 8 | puVar15[1] >> 8);
      Curl_infof(pCVar2,"%s\n",puVar15 + 2);
      break;
    case TFTP_EVENT_OACK:
      pCVar2 = state_01->conn->data;
      state_01->blksize = 0x200;
      local_c0 = (ushort *)((long)puVar15 + lVar11);
      puVar15 = puVar15 + 1;
      do {
        __n = (long)local_c0 - (long)puVar15;
        pvVar10 = memchr(puVar15,0,__n);
        uVar14 = (long)pvVar10 - (long)puVar15;
        if (pvVar10 == (void *)0x0) {
          uVar14 = __n;
        }
        uVar1 = uVar14 + 1;
        sVar13 = __n - uVar1;
        if (__n < uVar1 || sVar13 == 0) {
          puVar15 = (ushort *)0x0;
        }
        else {
          pvVar10 = memchr((void *)(uVar1 + (long)puVar15),0,sVar13);
          sVar12 = (long)pvVar10 - (long)(uVar1 + (long)puVar15);
          if (pvVar10 == (void *)0x0) {
            sVar12 = sVar13;
          }
          uVar14 = uVar14 + sVar12 + 2;
          local_e0 = puVar15;
          if (__n < uVar14) {
            puVar15 = (ushort *)0x0;
          }
          else {
            sVar13 = strlen((char *)puVar15);
            local_d8 = (char *)((long)puVar15 + sVar13 + 1);
            puVar15 = (ushort *)(uVar14 + (long)puVar15);
          }
        }
        if (puVar15 == (ushort *)0x0) {
          pcVar8 = "Malformed ACK packet, rejecting";
LAB_0012f7fe:
          Curl_failf(pCVar2,pcVar8);
LAB_0012f856:
          bVar16 = false;
          CVar4 = CURLE_TFTP_ILLEGAL;
          goto LAB_0012f85c;
        }
        Curl_infof(pCVar2,"got option=(%s) value=(%s)\n",local_e0);
        sVar13 = strlen((char *)local_e0);
        iVar5 = curl_strnequal((char *)local_e0,"blksize",sVar13);
        if (iVar5 != 0) {
          lVar11 = strtol(local_d8,(char **)0x0,10);
          if (lVar11 == 0) {
            pcVar8 = "invalid blocksize value in OACK packet";
            goto LAB_0012f7fe;
          }
          if (lVar11 < 0xffb9) {
            if (7 < lVar11) {
              if (state_01->requested_blksize < lVar11) {
                Curl_failf(pCVar2,"%s (%ld)","server requested blksize larger than allocated");
                goto LAB_0012f856;
              }
              state_01->blksize = (int)lVar11;
              Curl_infof(pCVar2,"%s (%d) %s (%d)\n","blksize parsed from OACK");
              goto LAB_0012f7b2;
            }
            pcVar8 = "blksize is smaller than min supported";
          }
          else {
            pcVar8 = "blksize is larger than max supported";
          }
          Curl_failf(pCVar2,"%s (%d)",pcVar8);
          goto LAB_0012f856;
        }
        sVar13 = strlen((char *)local_e0);
        iVar5 = curl_strnequal((char *)local_e0,"tsize",sVar13);
        if (iVar5 != 0) {
          lVar11 = strtol(local_d8,(char **)0x0,10);
          Curl_infof(pCVar2,"%s (%ld)\n","tsize parsed from OACK");
          if ((pCVar2->set).upload == false) {
            if (lVar11 == 0) {
              Curl_failf(pCVar2,"invalid tsize -:%s:- value in OACK packet",local_d8);
              goto LAB_0012f856;
            }
            Curl_pgrsSetDownloadSize(pCVar2,lVar11);
          }
        }
LAB_0012f7b2:
      } while (puVar15 < local_c0);
      CVar4 = CURLE_OK;
      bVar16 = true;
LAB_0012f85c:
      if (!bVar16) goto LAB_0012f885;
      break;
    default:
      Curl_failf(pCVar2,"%s","Internal error: Unexpected packet");
    }
    iVar5 = Curl_pgrsUpdate(conn);
    if (iVar5 == 0) {
      CVar4 = CURLE_OK;
    }
    else {
      tftp_state_machine(state_01,TFTP_EVENT_ERROR);
      CVar4 = CURLE_ABORTED_BY_CALLBACK;
    }
  }
LAB_0012f885:
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  CVar4 = tftp_state_machine(state_00,state_00->event);
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  bVar16 = state_00->state == TFTP_STATE_FIN;
  *local_b8 = bVar16;
joined_r0x0012f8aa:
  if (bVar16) {
    Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_multi_statemach(struct connectdata *conn, bool *done)
{
  int                   rc;
  tftp_event_t          event;
  CURLcode              result = CURLE_OK;
  struct Curl_easy  *data = conn->data;
  tftp_state_data_t     *state = (tftp_state_data_t *)conn->proto.tftpc;
  long                  timeout_ms = tftp_state_timeout(conn, &event);

  *done = FALSE;

  if(timeout_ms <= 0) {
    failf(data, "TFTP response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  if(event != TFTP_EVENT_NONE) {
    result = tftp_state_machine(state, event);
    if(result)
      return result;
    *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
    if(*done)
      /* Tell curl we're done */
      Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);
  }
  else {
    /* no timeouts to handle, check our socket */
    rc = SOCKET_READABLE(state->sockfd, 0);

    if(rc == -1) {
      /* bail out */
      int error = SOCKERRNO;
      failf(data, "%s", Curl_strerror(conn, error));
      state->event = TFTP_EVENT_ERROR;
    }
    else if(rc != 0) {
      result = tftp_receive_packet(conn);
      if(result)
        return result;
      result = tftp_state_machine(state, state->event);
      if(result)
        return result;
      *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
      if(*done)
        /* Tell curl we're done */
        Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);
    }
    /* if rc == 0, then select() timed out */
  }

  return result;
}